

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

void __thiscall TRootHandler_MNDX::~TRootHandler_MNDX(TRootHandler_MNDX *this)

{
  TMndxMarFile *this_00;
  size_t sVar1;
  undefined8 *puVar2;
  ulong local_20;
  size_t i;
  PMNDX_PACKAGE pPackage;
  TRootHandler_MNDX *this_local;
  
  (this->super_TRootHandler)._vptr_TRootHandler = (_func_int **)&PTR__TRootHandler_MNDX_001409b0;
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    this_00 = (this->MndxInfo).MarFiles[local_20];
    if (this_00 != (TMndxMarFile *)0x0) {
      TMndxMarFile::~TMndxMarFile(this_00);
      operator_delete(this_00,0x18);
    }
  }
  if (this->ppValidEntries != (PMNDX_ROOT_ENTRY *)0x0) {
    free(this->ppValidEntries);
  }
  if (this->pMndxEntries != (PMNDX_ROOT_ENTRY)0x0) {
    free(this->pMndxEntries);
  }
  local_20 = 0;
  while( true ) {
    sVar1 = CASC_ARRAY::ItemCount(&this->Packages);
    if (sVar1 <= local_20) break;
    puVar2 = (undefined8 *)CASC_ARRAY::ItemAt(&this->Packages,local_20);
    free((void *)*puVar2);
    local_20 = local_20 + 1;
  }
  CASC_ARRAY::Free(&this->Packages);
  TRootHandler::~TRootHandler(&this->super_TRootHandler);
  return;
}

Assistant:

~TRootHandler_MNDX()
    {
        PMNDX_PACKAGE pPackage;
        size_t i;

        for(i = 0; i < MAX_MAR_FILES; i++)
            delete MndxInfo.MarFiles[i];
        if(ppValidEntries != NULL)
            CASC_FREE(ppValidEntries);
        if(pMndxEntries != NULL)
            CASC_FREE(pMndxEntries);

        for(i = 0; i < Packages.ItemCount(); i++)
        {
            pPackage = (PMNDX_PACKAGE)Packages.ItemAt(i);
            CASC_FREE(pPackage->szFileName);
        }
        Packages.Free();
    }